

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O3

void GotoMission(int id)

{
  FILE *__stream;
  int iVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  int iVar6;
  bool bVar7;
  int ival;
  char line [256];
  uint local_444;
  long local_440;
  char local_438 [1032];
  
  local_444 = 0;
  pthread_mutex_lock((pthread_mutex_t *)&MissionFilesCS);
  __stream = missionfile;
  if (missionfile == (FILE *)0x0 && bMissionRunning == 0) {
    pcVar5 = "Cannot use goto outside a mission file.";
  }
  else {
    if ((uint)id < 0x400) {
      iVar6 = labels[(uint)id];
      if (iVar6 < 1) {
        local_440 = ftell((FILE *)missionfile);
        rewind((FILE *)missionfile);
        pcVar5 = fgets(local_438,0x100,(FILE *)missionfile);
        if (pcVar5 != (char *)0x0) {
          iVar6 = 2;
          do {
            iVar1 = __isoc99_sscanf(local_438,"label %d",&local_444);
            if (iVar1 == 1) {
              uVar4 = (ulong)local_444;
              if (uVar4 < 0x400) {
                if (labels[uVar4] < 1) {
                  labels[uVar4] = iVar6;
                  if (local_444 == id) goto LAB_0013a6ab;
                }
                else if (iVar6 != labels[uVar4]) {
                  printf("Label %d already exists.\n");
                }
              }
              else {
                puts("Invalid parameter.");
              }
            }
            pcVar5 = fgets(local_438,0x100,(FILE *)missionfile);
            iVar6 = iVar6 + 1;
          } while (pcVar5 != (char *)0x0);
        }
        puts("goto failed : label not found.");
        clearerr((FILE *)missionfile);
        iVar6 = fseek((FILE *)missionfile,(long)(int)local_440,0);
        if (iVar6 != 0) {
          pcVar5 = "File error.";
LAB_0013a6a6:
          puts(pcVar5);
        }
      }
      else {
        lVar2 = ftell((FILE *)missionfile);
        rewind((FILE *)__stream);
        if (iVar6 != 1) {
          iVar1 = 0;
          do {
            pcVar5 = fgets(local_438,0x400,(FILE *)__stream);
            if (pcVar5 == (char *)0x0) {
              clearerr((FILE *)__stream);
              fseek((FILE *)__stream,(long)(int)lVar2,0);
              pcVar5 = "goto failed.";
              goto LAB_0013a6a6;
            }
            sVar3 = strlen(pcVar5);
          } while (((sVar3 == 0x3ff) && (pcVar5[0x3fe] != '\n')) ||
                  (bVar7 = iVar1 != iVar6 + -2, iVar1 = iVar1 + 1, bVar7));
        }
      }
LAB_0013a6ab:
      pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
      return;
    }
    pcVar5 = "Invalid parameter.";
  }
  puts(pcVar5);
  pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
  return;
}

Assistant:

inline void GotoMission(int id)
{
	int cur = 0, i = 0, ival = 0;
	char* r = NULL;
	char line[MAX_BUF_LEN];

	EnterCriticalSection(&MissionFilesCS);
	if ((!bMissionRunning)&&(!missionfile))
	{
		printf("Cannot use goto outside a mission file.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	if ((id < 0)||(id >= MAX_NB_LABELS))
	{
		printf("Invalid parameter.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	if (labels[id] > 0) 
	{
		// Go to the next line after the label.
		if (fsetline(missionfile, labels[id]) != EXIT_SUCCESS)
		{
			printf("goto failed.\n");
		}
	}
	else
	{
		// Need to search for the label.

		cur = ftell(missionfile);
		rewind(missionfile);

		for (;;)
		{
			r = fgets(line, sizeof(line), missionfile);
			if (r == NULL) 
			{
				printf("goto failed : label not found.\n");
				clearerr(missionfile);
				// Go back to initial position.
				if (fseek(missionfile, cur, SEEK_SET) != EXIT_SUCCESS)
				{
					printf("File error.\n");
				}
				break;
			}
			i++;
			if (sscanf(line, "label %d", &ival) == 1)
			{
				if ((ival < 0)||(ival >= MAX_NB_LABELS))
				{
					printf("Invalid parameter.\n");
					continue;
				}
				if (labels[ival] > 0) 
				{
					if (labels[ival] != i+1)
					{
						printf("Label %d already exists.\n", ival);
						continue;
					}
				}
				else 
				{
					labels[ival] = i+1;
					if (ival == id) break;
				}
			}
		}
	}
	LeaveCriticalSection(&MissionFilesCS);
}